

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_minimal.cpp
# Opt level: O0

int main(void)

{
  reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  space;
  ostream *poVar1;
  neighbor<int,_float> nn;
  float query [3];
  kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  tree;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> points;
  max_leaf_size_t max_leaf_size;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
  *in_stack_fffffffffffffee8;
  neighbor_type *in_stack_fffffffffffffef0;
  float (*in_stack_fffffffffffffef8) [3];
  kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  *this;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
  *in_stack_ffffffffffffff20;
  initializer_list<std::array<float,_3UL>_> in_stack_ffffffffffffff28;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined1 *local_38;
  undefined8 local_30;
  int local_4;
  
  local_4 = 0;
  pico_tree::max_leaf_size_t::max_leaf_size_t((max_leaf_size_t *)&stack0xfffffffffffffff0,0xc);
  local_48 = 0x40a0000040800000;
  local_58 = 0x3f80000000000000;
  uStack_50 = 0x4040000040000000;
  local_38 = (undefined1 *)&stack0xffffffffffffffa8;
  local_30 = 2;
  this = (kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
          *)&stack0xffffffffffffffa7;
  std::allocator<std::array<float,_3UL>_>::allocator((allocator<std::array<float,_3UL>_> *)0x1012c3)
  ;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::allocator<std::array<float,_3UL>_>::~allocator
            ((allocator<std::array<float,_3UL>_> *)0x1012f4);
  space = std::ref<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                    (in_stack_fffffffffffffee8);
  pico_tree::
  kd_tree<std::reference_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
              *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (space_type)space._M_data,in_stack_ffffffffffffff10,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)this);
  pico_tree::
  kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  ::search_nn<float[3]>(this,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Index closest point: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_ffffffffffffff08);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  pico_tree::
  kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree((kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
              *)0x1013ad);
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
            ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)this);
  return local_4;
}

Assistant:

int main() {
  pico_tree::max_leaf_size_t max_leaf_size = 12;
  std::vector<std::array<float, 3>> points{
      {0.0f, 1.0f, 2.0f}, {3.0f, 4.0f, 5.0f}};

  // The kd_tree takes the input by value. To prevent a copy, we can either move
  // the point set into the tree or the point set can be taken by reference by
  // wrapping it in an std::reference_wrapper. Below we take the input by
  // reference:
  pico_tree::kd_tree tree(std::ref(points), max_leaf_size);

  float query[3] = {4.0f, 4.0f, 4.0f};
  pico_tree::neighbor<int, float> nn;
  tree.search_nn(query, nn);

  std::cout << "Index closest point: " << nn.index << std::endl;

  return 0;
}